

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

void __thiscall wallet::RecordHeader::Unserialize<AutoFile>(RecordHeader *this,AutoFile *s)

{
  long lVar1;
  uint16_t uVar2;
  unsigned_short *in_RSI;
  AutoFile *in_RDI;
  long in_FS_OFFSET;
  uint8_t uint8_type;
  AutoFile *this_00;
  byte local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AutoFile::operator>>(in_RDI,in_RSI);
  AutoFile::operator>>(this_00,(uchar *)in_RSI);
  *(byte *)((long)&in_RDI->m_file + 2) = local_9 & 0x7f;
  *(bool *)((long)&in_RDI->m_file + 3) = (local_9 & 0x80) != 0;
  if (((ulong)in_RDI->m_file & 0x100000000) != 0) {
    uVar2 = internal_bswap_16((uint16_t)((ulong)in_RDI >> 0x30));
    *(uint16_t *)&in_RDI->m_file = uVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> len;

        uint8_t uint8_type;
        s >> uint8_type;
        type = static_cast<RecordType>(uint8_type & ~static_cast<uint8_t>(RecordType::DELETE));
        deleted = uint8_type & static_cast<uint8_t>(RecordType::DELETE);

        if (other_endian) {
            len = internal_bswap_16(len);
        }
    }